

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::write85
          (Fl_PostScript_Graphics_Driver *this,void *data,uchar *p,int len)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  
  puVar5 = p + len;
  while (p < puVar5) {
    lVar2 = 4 - (long)*(int *)((long)data + 4);
    lVar3 = (long)puVar5 - (long)p;
    if (lVar2 <= lVar3) {
      lVar3 = lVar2;
    }
    iVar4 = (int)lVar3;
    memcpy((void *)((long)*(int *)((long)data + 4) + (long)data),p,(long)iVar4);
    p = p + iVar4;
    iVar4 = iVar4 + *(int *)((long)data + 4);
    *(int *)((long)data + 4) = iVar4;
    if (iVar4 == 4) {
      uVar1 = convert85((uchar *)data,(uchar *)((long)data + 0xc));
      fwrite((uchar *)((long)data + 0xc),(ulong)uVar1,1,(FILE *)this->output);
      *(undefined4 *)((long)data + 4) = 0;
      iVar4 = *(int *)((long)data + 8);
      *(int *)((long)data + 8) = iVar4 + 1;
      if (0xe < iVar4) {
        fputc(10,(FILE *)this->output);
        *(undefined4 *)((long)data + 8) = 0;
      }
    }
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write85(void *data, const uchar *p, int len) // sends len input bytes for ASCII85 encoding
{
  struct85 *big = (struct85 *)data;
  const uchar *last = p + len;
  while (p < last) {
    int c = 4 - big->l4;
    if (last-p < c) c = last-p;
    memcpy(big->bytes4 + big->l4, p, c);
    p += c;
    big->l4 += c;
    if (big->l4 == 4) {
      c = convert85(big->bytes4, big->chars5);
      fwrite(big->chars5, c, 1, output);
      big->l4 = 0;
      if (++big->blocks >= 16) { fputc('\n', output); big->blocks = 0; }
    }
  }
}